

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O2

bool tinyusdz::tydra::ListPrims<tinyusdz::Scope>(Stage *stage,PathPrimMap<tinyusdz::Scope> *m)

{
  pointer pPVar1;
  Prim *root_prim;
  pointer prim;
  allocator local_51;
  string local_50;
  
  pPVar1 = (stage->_root_nodes).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (prim = (stage->_root_nodes).
              super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
              super__Vector_impl_data._M_start; prim != pPVar1; prim = prim + 1) {
    ::std::__cxx11::string::string((string *)&local_50,"",&local_51);
    anon_unknown_6::TraverseRec<tinyusdz::Scope>(&local_50,prim,0,m);
    ::std::__cxx11::string::_M_dispose();
  }
  return true;
}

Assistant:

bool ListPrims(const tinyusdz::Stage &stage, PathPrimMap<T> &m /* output */) {
  // Should report error at compilation stege.
  static_assert(
      (value::TypeId::TYPE_ID_MODEL_BEGIN <= value::TypeTraits<T>::type_id()) &&
          (value::TypeId::TYPE_ID_MODEL_END > value::TypeTraits<T>::type_id()),
      "Not a Prim type.");

  // Check at runtime. Just in case...
  if ((value::TypeId::TYPE_ID_MODEL_BEGIN <= value::TypeTraits<T>::type_id()) &&
      (value::TypeId::TYPE_ID_MODEL_END > value::TypeTraits<T>::type_id())) {
    // Ok
  } else {
    return false;
  }

  for (const auto &root_prim : stage.root_prims()) {
    TraverseRec(/* root path is empty */ "", root_prim, /* depth */ 0, m);
  }

  return true;
}